

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rational.h
# Opt level: O1

void soplex::powRound(Rational *r)

{
  uint uVar1;
  type_conflict1 tVar2;
  Rational *__src;
  undefined8 uVar3;
  number<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>,_(boost::multiprecision::expression_template_option)1>
  *__src_00;
  Integer base;
  Integer roundval;
  Integer num;
  Integer den;
  data_type local_b8;
  uint local_a8;
  undefined2 local_a4;
  char local_a2;
  data_type local_98;
  int local_88;
  undefined2 local_84;
  char local_82;
  uint local_6c;
  data_type local_68;
  undefined4 local_58;
  undefined2 local_54;
  char local_52;
  data_type local_48;
  undefined4 local_38;
  undefined2 local_34;
  char local_32;
  
  local_98.la[0] = 0;
  local_88 = 1;
  local_84 = 0x100;
  local_82 = '\0';
  local_48.la[0] = 0;
  local_38 = 1;
  local_34 = 0x100;
  local_32 = '\0';
  local_68.la[0] = 0;
  local_58 = 1;
  local_54 = 0x100;
  local_52 = '\0';
  local_b8.la[0] = 0;
  local_a2 = (r->m_backend).m_value.num.m_backend.
             super_cpp_int_base<0U,_4294967295U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>,_false>
             .m_alias;
  uVar1 = (r->m_backend).m_value.num.m_backend.
          super_cpp_int_base<0U,_4294967295U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>,_false>
          .m_limbs;
  local_a8 = 0;
  if ((bool)local_a2 != false) {
    local_a8 = uVar1;
  }
  local_a4 = CONCAT11(local_a2,(r->m_backend).m_value.num.m_backend.
                               super_cpp_int_base<0U,_4294967295U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>,_false>
                               .m_sign) ^ 0x100;
  if ((bool)local_a2 == true) {
    local_b8.la[0] =
         (r->m_backend).m_value.num.m_backend.
         super_cpp_int_base<0U,_4294967295U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>,_false>
         .m_data.la[0];
    local_b8.ld.data =
         (r->m_backend).m_value.num.m_backend.
         super_cpp_int_base<0U,_4294967295U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>,_false>
         .m_data.ld.data;
  }
  else {
    boost::multiprecision::backends::
    cpp_int_base<0U,_4294967295U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>,_false>
    ::resize((cpp_int_base<0U,_4294967295U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>,_false>
              *)&local_b8.ld,uVar1,uVar1);
    uVar3 = &local_b8;
    if (local_a4._1_1_ == '\0') {
      uVar3 = local_b8.ld.data;
    }
    __src = r;
    if ((r->m_backend).m_value.num.m_backend.
        super_cpp_int_base<0U,_4294967295U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>,_false>
        .m_internal == false) {
      __src = (Rational *)
              (r->m_backend).m_value.num.m_backend.
              super_cpp_int_base<0U,_4294967295U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>,_false>
              .m_data.ld.data;
    }
    memcpy((void *)uVar3,__src,
           (ulong)(r->m_backend).m_value.num.m_backend.
                  super_cpp_int_base<0U,_4294967295U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>,_false>
                  .m_limbs << 3);
  }
  boost::multiprecision::backends::
  cpp_int_base<0U,_4294967295U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>,_false>
  ::operator=((cpp_int_base<0U,_4294967295U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>,_false>
               *)&local_68.ld,
              (cpp_int_base<0U,_4294967295U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>,_false>
               *)&local_b8.ld);
  if ((local_a4._1_1_ == '\0') && (local_a2 == '\0')) {
    operator_delete(local_b8.ld.data,(local_b8.la[0] & 0xffffffff) << 3);
  }
  __src_00 = &(r->m_backend).m_value.den;
  local_b8.la[0] = 0;
  local_a2 = (r->m_backend).m_value.den.m_backend.
             super_cpp_int_base<0U,_4294967295U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>,_false>
             .m_alias;
  uVar1 = (r->m_backend).m_value.den.m_backend.
          super_cpp_int_base<0U,_4294967295U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>,_false>
          .m_limbs;
  local_a8 = 0;
  if ((bool)local_a2 != false) {
    local_a8 = uVar1;
  }
  local_a4 = CONCAT11(local_a2,(r->m_backend).m_value.den.m_backend.
                               super_cpp_int_base<0U,_4294967295U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>,_false>
                               .m_sign) ^ 0x100;
  if ((bool)local_a2 == true) {
    local_b8.la[0] =
         (__src_00->m_backend).
         super_cpp_int_base<0U,_4294967295U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>,_false>
         .m_data.la[0];
    local_b8.ld.data =
         (r->m_backend).m_value.den.m_backend.
         super_cpp_int_base<0U,_4294967295U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>,_false>
         .m_data.ld.data;
  }
  else {
    boost::multiprecision::backends::
    cpp_int_base<0U,_4294967295U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>,_false>
    ::resize((cpp_int_base<0U,_4294967295U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>,_false>
              *)&local_b8.ld,uVar1,uVar1);
    uVar3 = &local_b8;
    if (local_a4._1_1_ == '\0') {
      uVar3 = local_b8.ld.data;
    }
    if ((r->m_backend).m_value.den.m_backend.
        super_cpp_int_base<0U,_4294967295U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>,_false>
        .m_internal == false) {
      __src_00 = (number<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>,_(boost::multiprecision::expression_template_option)1>
                  *)(r->m_backend).m_value.den.m_backend.
                    super_cpp_int_base<0U,_4294967295U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>,_false>
                    .m_data.ld.data;
    }
    memcpy((void *)uVar3,__src_00,
           (ulong)(r->m_backend).m_value.den.m_backend.
                  super_cpp_int_base<0U,_4294967295U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>,_false>
                  .m_limbs << 3);
  }
  boost::multiprecision::backends::
  cpp_int_base<0U,_4294967295U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>,_false>
  ::operator=((cpp_int_base<0U,_4294967295U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>,_false>
               *)&local_48.ld,
              (cpp_int_base<0U,_4294967295U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>,_false>
               *)&local_b8.ld);
  if ((local_a4._1_1_ == '\0') && (local_a2 == '\0')) {
    operator_delete(local_b8.ld.data,(local_b8.la[0] & 0xffffffff) << 3);
  }
  local_b8.la[0] = (limb_type)&local_68;
  local_b8.ld.data = (limb_pointer)&local_48;
  boost::multiprecision::
  number<boost::multiprecision::backends::cpp_int_backend<0u,0u,(boost::multiprecision::cpp_integer_type)1,(boost::multiprecision::cpp_int_check_type)0,std::allocator<unsigned_long_long>>,(boost::multiprecision::expression_template_option)1>
  ::
  do_assign<boost::multiprecision::detail::expression<boost::multiprecision::detail::divide_immediates,boost::multiprecision::number<boost::multiprecision::backends::cpp_int_backend<0u,0u,(boost::multiprecision::cpp_integer_type)1,(boost::multiprecision::cpp_int_check_type)0,std::allocator<unsigned_long_long>>,(boost::multiprecision::expression_template_option)1>,boost::multiprecision::number<boost::multiprecision::backends::cpp_int_backend<0u,0u,(boost::multiprecision::cpp_integer_type)1,(boost::multiprecision::cpp_int_check_type)0,std::allocator<unsigned_long_long>>,(boost::multiprecision::expression_template_option)1>,void,void>>
            ((number<boost::multiprecision::backends::cpp_int_backend<0u,0u,(boost::multiprecision::cpp_integer_type)1,(boost::multiprecision::cpp_int_check_type)0,std::allocator<unsigned_long_long>>,(boost::multiprecision::expression_template_option)1>
              *)&local_98.ld,
             (expression<boost::multiprecision::detail::divide_immediates,_boost::multiprecision::number<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>,_(boost::multiprecision::expression_template_option)1>,_boost::multiprecision::number<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>,_(boost::multiprecision::expression_template_option)1>,_void,_void>
              *)&local_b8.ld,(divide_immediates *)&local_6c);
  if (((char)local_84 == '\0') && (local_88 == 1)) {
    uVar3 = &local_98;
    if (local_84._1_1_ == '\0') {
      uVar3 = local_98.ld.data;
    }
    if (*(limb_type *)uVar3 == 0) {
      local_6c = 1;
      goto LAB_0032d2e1;
    }
  }
  tVar2 = boost::multiprecision::backends::
          eval_msb<0u,0u,(boost::multiprecision::cpp_integer_type)1,(boost::multiprecision::cpp_int_check_type)0,std::allocator<unsigned_long_long>>
                    ((cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>
                      *)&local_98.ld);
  local_6c = tVar2 + 1;
LAB_0032d2e1:
  local_b8.la[0] = 2;
  local_a8 = 1;
  local_a4 = 0x100;
  local_a2 = '\0';
  boost::multiprecision::default_ops::detail::
  pow_imp<boost::multiprecision::backends::cpp_int_backend<0u,0u,(boost::multiprecision::cpp_integer_type)1,(boost::multiprecision::cpp_int_check_type)0,std::allocator<unsigned_long_long>>,unsigned_int>
            ((cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>
              *)&local_98.ld,
             (cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>
              *)&local_b8.ld,&local_6c,
             (false_ *)_ZZNK5boost17integral_constantIbLb0EEcvRKN4mpl_5bool_ILb0EEEEvE5pdata);
  boost::
  rational<boost::multiprecision::number<boost::multiprecision::backends::cpp_int_backend<0u,0u,(boost::multiprecision::cpp_integer_type)1,(boost::multiprecision::cpp_int_check_type)0,std::allocator<unsigned_long_long>>,(boost::multiprecision::expression_template_option)1>>
  ::operator=((rational<boost::multiprecision::number<boost::multiprecision::backends::cpp_int_backend<0u,0u,(boost::multiprecision::cpp_integer_type)1,(boost::multiprecision::cpp_int_check_type)0,std::allocator<unsigned_long_long>>,(boost::multiprecision::expression_template_option)1>>
               *)r,(cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>
                    *)&local_98.ld);
  if ((local_a4._1_1_ == '\0') && (local_a2 == '\0')) {
    operator_delete(local_b8.ld.data,(local_b8.la[0] & 0xffffffff) << 3);
  }
  if ((local_54._1_1_ == '\0') && (local_52 == '\0')) {
    operator_delete(local_68.ld.data,(local_68.la[0] & 0xffffffff) << 3);
  }
  if ((local_34._1_1_ == '\0') && (local_32 == '\0')) {
    operator_delete(local_48.ld.data,(local_48.la[0] & 0xffffffff) << 3);
  }
  if ((local_84._1_1_ == '\0') && (local_82 == '\0')) {
    operator_delete(local_98.ld.data,(local_98.la[0] & 0xffffffff) << 3);
  }
  return;
}

Assistant:

inline void powRound(Rational& r)
{
   Integer roundval;
   Integer den;
   Integer num;

   num = numerator(r);
   den = denominator(r);
   roundval = num / den;

   size_t binlog = roundval == 0 ? 1 : msb(roundval) + 1;
   Integer base = 2;

   roundval = boost::multiprecision::pow(base, (unsigned int)binlog);

   r = roundval;
}